

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O1

Atom_p __thiscall indigox::Molecule::GetAtomUniqueID(Molecule *this,uid_t i)

{
  uid_t *puVar1;
  element_type *peVar2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  uid_t *puVar5;
  Atom_p AVar6;
  
  puVar5 = *(uid_t **)(i + 0x40);
  puVar1 = *(uid_t **)(i + 0x48);
  _Var4._M_pi = in_RDX;
  do {
    bVar3 = puVar5 != puVar1;
    if (!bVar3) {
LAB_0010ab4f:
      (this->super_CountableObject<indigox::Molecule>).id_ = 0;
      (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
      super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_0010ab55:
      AVar6.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var4._M_pi;
      AVar6.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Atom_p)AVar6.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>;
    }
    (this->super_CountableObject<indigox::Molecule>).id_ = *puVar5;
    peVar2 = (element_type *)puVar5[1];
    (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
    super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    if (peVar2 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(peVar2->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                 super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(peVar2->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                      super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(peVar2->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                 super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(peVar2->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
                      super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      }
    }
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         (this->super_CountableObject<indigox::Molecule>).id_ == in_RDX) {
      if (bVar3) goto LAB_0010ab55;
      goto LAB_0010ab4f;
    }
    peVar2 = (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
             super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2);
      _Var4._M_pi = extraout_RDX;
    }
    puVar5 = puVar5 + 2;
  } while( true );
}

Assistant:

Atom_p Molecule::GetAtomUniqueID(uid_t i) {
  for (Atom_p atm : atoms_) {
    if (atm->GetUniqueID() == i) return atm;
  }
  return Atom_p();
}